

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_luma_subsampling_444_hbd_ssse3
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  
  pauVar1 = (undefined1 (*) [16])(pred_buf_q3 + (uint)(height << 5));
  do {
    if (width == 4) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)*(undefined1 (*) [16])input;
      auVar2 = psllw(auVar2,3);
      *(long *)*(undefined1 (*) [16])pred_buf_q3 = auVar2._0_8_;
    }
    else {
      auVar2 = psllw(*(undefined1 (*) [16])input,3);
      *(undefined1 (*) [16])pred_buf_q3 = auVar2;
      if (0xf < width) {
        auVar2 = psllw(*(undefined1 (*) [16])((long)input + 0x10),3);
        *(undefined1 (*) [16])((long)pred_buf_q3 + 0x10) = auVar2;
        if (width == 0x20) {
          auVar2 = psllw(*(undefined1 (*) [16])((long)input + 0x20),3);
          *(undefined1 (*) [16])((long)pred_buf_q3 + 0x20) = auVar2;
          auVar2 = psllw(*(undefined1 (*) [16])((long)input + 0x30),3);
          *(undefined1 (*) [16])((long)pred_buf_q3 + 0x30) = auVar2;
        }
      }
    }
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
    input = (uint16_t *)(*(undefined1 (*) [16])input + (long)input_stride * 2);
  } while (pred_buf_q3 < pauVar1);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_444_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + height * CFL_BUF_LINE;
  do {
    if (width == 4) {
      const __m128i row = _mm_slli_epi16(_mm_loadl_epi64((__m128i *)input), 3);
      _mm_storel_epi64((__m128i *)pred_buf_q3, row);
    } else {
      const __m128i row = _mm_slli_epi16(_mm_loadu_si128((__m128i *)input), 3);
      _mm_storeu_si128((__m128i *)pred_buf_q3, row);
      if (width >= 16) {
        __m128i row_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        row_1 = _mm_slli_epi16(row_1, 3);
        _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1, row_1);
        if (width == 32) {
          __m128i row_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          row_2 = _mm_slli_epi16(row_2, 3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 2, row_2);
          __m128i row_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          row_3 = _mm_slli_epi16(row_3, 3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 3, row_3);
        }
      }
    }
    input += input_stride;
    pred_buf_q3 += CFL_BUF_LINE;
  } while (pred_buf_q3 < end);
}